

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall leveldb::VersionEdit::SetComparatorName(VersionEdit *this,Slice *name)

{
  Slice local_38 [2];
  Slice *local_18;
  Slice *name_local;
  VersionEdit *this_local;
  
  this->has_comparator_ = true;
  local_18 = name;
  name_local = (Slice *)this;
  Slice::ToString_abi_cxx11_(local_38);
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void SetComparatorName(const Slice& name) {
    has_comparator_ = true;
    comparator_ = name.ToString();
  }